

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::ScanLineInputFile::ScanLineInputFile(ScanLineInputFile *this,InputPartData *part)

{
  bool bVar1;
  byte bVar2;
  ArgExc *this_00;
  _func_int **pp_Var3;
  long in_RSI;
  GenericInputFile *in_RDI;
  Header *in_stack_00000008;
  ScanLineInputFile *in_stack_00000010;
  int in_stack_0000001c;
  Data *in_stack_00000020;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000038;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  
  GenericInputFile::GenericInputFile(in_RDI);
  in_RDI->_vptr_GenericInputFile = (_func_int **)&PTR__ScanLineInputFile_0350fab0;
  Header::type_abi_cxx11_((Header *)0x8bb84a);
  bVar1 = std::operator!=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (!bVar1) {
    pp_Var3 = (_func_int **)operator_new(0x168);
    Data::Data(in_stack_00000020,in_stack_0000001c);
    in_RDI[1]._vptr_GenericInputFile = pp_Var3;
    in_RDI[2]._vptr_GenericInputFile = *(_func_int ***)(in_RSI + 0x48);
    bVar2 = (**(code **)(*(long *)in_RDI[2]._vptr_GenericInputFile[5] + 0x10))();
    *(byte *)((long)in_RDI[1]._vptr_GenericInputFile + 0x144) = bVar2 & 1;
    *(undefined4 *)(in_RDI[1]._vptr_GenericInputFile + 0xc) = *(undefined4 *)(in_RSI + 0x40);
    initialize(in_stack_00000010,in_stack_00000008);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)i,in_stack_00000038);
    *(undefined4 *)(in_RDI[1]._vptr_GenericInputFile + 0x28) = *(undefined4 *)(in_RSI + 0x3c);
    *(undefined1 *)(in_RDI[1]._vptr_GenericInputFile + 0x19) = 1;
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this_00,"Can\'t build a ScanLineInputFile from a type-mismatched part.");
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

ScanLineInputFile::ScanLineInputFile(InputPartData* part)
{
    if (part->header.type() != SCANLINEIMAGE)
        throw IEX_NAMESPACE::ArgExc("Can't build a ScanLineInputFile from a type-mismatched part.");

    _data = new Data(part->numThreads);
    _streamData = part->mutex;
    _data->memoryMapped = _streamData->is->isMemoryMapped();

    _data->version = part->version;

    try
    {
       initialize(part->header);
    }
    catch(...)
    {
        if (!_data->memoryMapped)
        {
            for (size_t i = 0; i < _data->lineBuffers.size(); i++)
            {
                if( _data->lineBuffers[i] )
                {
                   EXRFreeAligned(_data->lineBuffers[i]->buffer);
                   _data->lineBuffers[i]->buffer=nullptr;
                }
            }
        }
        
        delete _data;
        throw;
    }
    _data->lineOffsets = part->chunkOffsets;

    _data->partNumber = part->partNumber;
    //
    // (TODO) change this code later.
    // The completeness of the file should be detected in MultiPartInputFile.
    //
    _data->fileIsComplete = true;
}